

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::AssertionPrinter::AssertionPrinter
          (AssertionPrinter *this,ostream *_stream,AssertionStats *_stats,bool _printInfoMessages)

{
  const_iterator cVar1;
  byte in_CL;
  pointer in_RDX;
  pointer in_RSI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000028;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000030;
  
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = in_RSI;
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = in_RDX;
  (in_RDI->super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&in_RDX->field_0x8;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_00000030,in_stack_00000028);
  cVar1 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin(in_RDI);
  in_RDI[2].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
  super__Vector_impl_data._M_start = cVar1._M_current;
  *(byte *)&in_RDI[2].super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = in_CL & 1;
  return;
}

Assistant:

AssertionPrinter( std::ostream& _stream, AssertionStats const& _stats, bool _printInfoMessages )
            : stream( _stream )
            , stats( _stats )
            , result( _stats.assertionResult )
            , messages( _stats.infoMessages )
            , itMessage( _stats.infoMessages.begin() )
            , printInfoMessages( _printInfoMessages )
            {}